

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O0

void taking_mouse_down(void)

{
  uint uVar1;
  sbyte sVar2;
  int iVar4;
  int iVar5;
  uint *puVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  uint local_170;
  int local_16c;
  uint local_168;
  uint local_164;
  uint local_160;
  uint local_15c;
  uint local_f0;
  int local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  uint local_a8;
  int srcRshift;
  uint newS;
  uint savedS;
  uint shS;
  uint *src32addr;
  uint *dst32addr;
  uint sdw_mask;
  uint postloop_mask;
  uint preloop_mask;
  int bb_fast;
  uint *OrigDstAddr;
  uint *OrigSrcAddr;
  int fwd;
  int src32rbit;
  int dst32rbit;
  int abc;
  UNSIGNED x32ia;
  UNSIGNED x32nbyt;
  UNSIGNED x32byta;
  uint local_38;
  uint mask;
  uint dstdata;
  uint dstold;
  uint srcRmask;
  int dst32lbit;
  int srcLshift;
  int src32lbit;
  int dstnumL;
  int num_lines_remaining;
  DLword *dstbase;
  DLword *srcbase;
  sbyte sVar3;
  
  if (DisplayInitialized != 0) {
    dstbase = MonoCursor_savebitmap;
    iVar4 = LastCursorY * ((int)displaywidth / 0x10);
    taking_mouse_down::sx = 0;
    taking_mouse_down::dx = LastCursorX;
    taking_mouse_down::w = LastCursorClippingX;
    taking_mouse_down::h = LastCursorClippingY;
    taking_mouse_down::srcbpl = 0x10;
    taking_mouse_down::dstbpl = displaywidth;
    taking_mouse_down::op = 0;
    srcRmask = 0;
    dstdata = 0;
    OrigSrcAddr._4_4_ = 0;
    OrigDstAddr = (uint *)0x0;
    srcRshift = 0;
    local_a8 = 0;
    src32lbit = LastCursorClippingY;
    bVar8 = taking_mouse_down::backwardflg != 0;
    bVar9 = false;
    if (taking_mouse_down::gray == 0) {
      if (bVar8) {
        uVar1 = (LastCursorX + LastCursorClippingX) - 1;
        if ((int)uVar1 < 0) {
          lVar7 = -(long)((int)(7 - uVar1) >> 3);
        }
        else {
          lVar7 = (long)((int)uVar1 >> 3);
        }
        x32nbyt = (long)DisplayRegion68k + lVar7 + (long)iVar4 * 2;
        _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
        fwd = (int)((x32nbyt & 3) << 3) + (uVar1 & 7);
        dstold = (fwd - LastCursorClippingX) + 1U & 0x1f;
        sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
        if (dstold == 0) {
          local_e8 = 0xffffffff;
        }
        else {
          local_e8 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        dst32addr._4_4_ = local_e8;
        dst32addr._0_4_ = sdw_mask & local_e8;
        if ((LastCursorClippingX - fwd) + -1 < 1) {
          local_ec = 0;
        }
        else {
          local_ec = (LastCursorClippingX - fwd) + -1 >> 5;
        }
        srcLshift = local_ec;
        uVar1 = LastCursorClippingX - 1;
        if ((int)uVar1 < 0) {
          lVar7 = -(long)((int)(7 - uVar1) >> 3);
        }
        else {
          lVar7 = (long)((int)uVar1 >> 3);
        }
        x32nbyt = (long)MonoCursor_savebitmap + lVar7;
        OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
        OrigSrcAddr._4_4_ = (int)((x32nbyt & 3) << 3) + (uVar1 & 7);
        dst32lbit = (OrigSrcAddr._4_4_ - LastCursorClippingX) + 1 & 0x1f;
        local_a8 = dstold - dst32lbit;
        srcRmask = dst32lbit - dstold & 0x1f;
        if (srcRmask == 0) {
          local_f0 = 0;
        }
        else {
          local_f0 = -1 << (sbyte)srcRmask ^ 0xffffffff;
        }
        dstdata = local_f0;
      }
      else {
        if (LastCursorX < 0) {
          lVar7 = -(long)(7 - LastCursorX >> 3);
        }
        else {
          lVar7 = (long)(LastCursorX >> 3);
        }
        x32nbyt = (long)DisplayRegion68k + lVar7 + (long)iVar4 * 2;
        _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
        dstold = (int)((x32nbyt & 3) << 3) + (LastCursorX & 7U);
        fwd = (dstold + LastCursorClippingX) - 1 & 0x1f;
        if (dstold == 0) {
          local_e0 = 0xffffffff;
        }
        else {
          local_e0 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        sdw_mask = local_e0;
        dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
        dst32addr._0_4_ = local_e0 & dst32addr._4_4_;
        srcLshift = ((int)(dstold + LastCursorClippingX) >> 5) + -1;
        dst32lbit = 0;
        OrigSrcAddr._4_4_ = LastCursorClippingX - 1U & 0x1f;
        srcRmask = -dstold & 0x1f;
        if (srcRmask == 0) {
          local_e4 = 0xffffffff;
        }
        else {
          local_e4 = -1 << (sbyte)srcRmask ^ 0xffffffff;
        }
        dstdata = local_e4;
        OrigDstAddr = (uint *)MonoCursor_savebitmap;
        local_a8 = dstold;
      }
      local_a8 = local_a8 & 0x1f;
      _savedS = OrigDstAddr;
    }
    else {
      if (LastCursorX < 0) {
        lVar7 = -(long)(7 - LastCursorX >> 3);
      }
      else {
        lVar7 = (long)(LastCursorX >> 3);
      }
      x32nbyt = (long)DisplayRegion68k + lVar7 + (long)iVar4 * 2;
      _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
      dstold = (int)((x32nbyt & 3) << 3) + (LastCursorX & 7U);
      fwd = (dstold + LastCursorClippingX) - 1 & 0x1f;
      if (dstold == 0) {
        local_dc = 0xffffffff;
      }
      else {
        local_dc = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
      }
      sdw_mask = local_dc;
      dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
      dst32addr._0_4_ = local_dc & dst32addr._4_4_;
      srcLshift = ((int)(dstold + LastCursorClippingX) >> 5) + -1;
      bVar9 = (displaywidth & 0x1f) == 0;
      dst32lbit = 0;
      _savedS = OrigDstAddr;
    }
    while( true ) {
      src32addr = _preloop_mask;
      iVar4 = src32lbit + -1;
      if (src32lbit < 1) break;
      if (taking_mouse_down::gray == 0) {
        sVar2 = (sbyte)local_a8;
        sVar3 = (sbyte)srcRmask;
        if (bVar8) {
          if ((OrigSrcAddr._4_4_ < (uint)fwd) &&
             ((int)(dstold + 1) < dst32lbit + taking_mouse_down::w)) {
            puVar6 = _savedS + -1;
            uVar1 = *_savedS;
            _savedS = _savedS + -2;
            newS = uVar1 >> sVar2 & dstdata | *puVar6 << sVar3;
            srcRshift = *puVar6 >> sVar2 & dstdata;
          }
          else {
            if (OrigSrcAddr._4_4_ < (uint)fwd) {
              newS = *_savedS >> sVar2 & dstdata;
            }
            else {
              newS = *_savedS << sVar3;
              srcRshift = *_savedS >> sVar2 & dstdata;
            }
            _savedS = _savedS + -1;
          }
          if (taking_mouse_down::src_comp != 0) {
            newS = newS ^ 0xffffffff;
          }
          if ((int)(dstold + taking_mouse_down::w) < 0x21) {
            x32byta._4_4_ = (uint)dst32addr;
          }
          else {
            local_38 = *_preloop_mask;
            uVar1 = local_38 & ~sdw_mask;
            switch(taking_mouse_down::op) {
            case 0:
              local_38 = newS;
              break;
            case 1:
              local_38 = newS & local_38;
              break;
            case 2:
              local_38 = newS | local_38;
              break;
            case 3:
              local_38 = newS ^ local_38;
            }
            *_preloop_mask = uVar1 | sdw_mask & local_38;
            src32addr = _preloop_mask + -1;
            if (dst32lbit == dstold) {
              if (taking_mouse_down::src_comp == 0) {
                switch(taking_mouse_down::op) {
                case 0:
                  local_c4 = srcLshift;
                  while (local_c4 = local_c4 + -1, -1 < local_c4) {
                    *src32addr = *_savedS;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 1:
                  local_c4 = srcLshift;
                  while (local_c4 = local_c4 + -1, -1 < local_c4) {
                    *src32addr = *_savedS & *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 2:
                  local_c4 = srcLshift;
                  while (local_c4 = local_c4 + -1, -1 < local_c4) {
                    *src32addr = *_savedS | *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 3:
                  local_c4 = srcLshift;
                  while (local_c4 = local_c4 + -1, -1 < local_c4) {
                    *src32addr = *_savedS ^ *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                }
              }
              else {
                switch(taking_mouse_down::op) {
                case 0:
                  local_c0 = srcLshift;
                  while (local_c0 = local_c0 + -1, -1 < local_c0) {
                    *src32addr = *_savedS ^ 0xffffffff;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 1:
                  local_c0 = srcLshift;
                  while (local_c0 = local_c0 + -1, -1 < local_c0) {
                    *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 2:
                  local_c0 = srcLshift;
                  while (local_c0 = local_c0 + -1, -1 < local_c0) {
                    *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 3:
                  local_c0 = srcLshift;
                  while (local_c0 = local_c0 + -1, -1 < local_c0) {
                    *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                }
              }
            }
            else if (taking_mouse_down::src_comp == 0) {
              switch(taking_mouse_down::op) {
              case 0:
                local_cc = srcLshift;
                while (local_cc = local_cc + -1, -1 < local_cc) {
                  uVar1 = srcRshift | *_savedS << sVar3;
                  srcRshift = *_savedS >> sVar2;
                  *src32addr = uVar1;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_cc = srcLshift;
                while (local_cc = local_cc + -1, -1 < local_cc) {
                  uVar1 = srcRshift | *_savedS << sVar3;
                  srcRshift = *_savedS >> sVar2;
                  *src32addr = uVar1 & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_cc = srcLshift;
                while (local_cc = local_cc + -1, -1 < local_cc) {
                  uVar1 = srcRshift | *_savedS << sVar3;
                  srcRshift = *_savedS >> sVar2;
                  *src32addr = uVar1 | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_cc = srcLshift;
                while (local_cc = local_cc + -1, -1 < local_cc) {
                  uVar1 = srcRshift | *_savedS << sVar3;
                  srcRshift = *_savedS >> sVar2;
                  *src32addr = uVar1 ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
            else {
              switch(taking_mouse_down::op) {
              case 0:
                local_c8 = srcLshift;
                while (local_c8 = local_c8 + -1, -1 < local_c8) {
                  uVar1 = srcRshift | *_savedS << sVar3;
                  srcRshift = *_savedS >> sVar2;
                  *src32addr = uVar1 ^ 0xffffffff;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_c8 = srcLshift;
                while (local_c8 = local_c8 + -1, -1 < local_c8) {
                  uVar1 = srcRshift | *_savedS << sVar3;
                  srcRshift = *_savedS >> sVar2;
                  *src32addr = (uVar1 ^ 0xffffffff) & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_c8 = srcLshift;
                while (local_c8 = local_c8 + -1, -1 < local_c8) {
                  uVar1 = srcRshift | *_savedS << sVar3;
                  srcRshift = *_savedS >> sVar2;
                  *src32addr = uVar1 ^ 0xffffffff | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_c8 = srcLshift;
                while (local_c8 = local_c8 + -1, -1 < local_c8) {
                  uVar1 = srcRshift | *_savedS << sVar3;
                  srcRshift = *_savedS >> sVar2;
                  *src32addr = uVar1 ^ 0xffffffff ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
            if (dstold == 0) goto LAB_00144352;
            if ((uint)dst32lbit < dstold) {
              newS = srcRshift;
            }
            else {
              newS = srcRshift | *_savedS << sVar3;
            }
            if (taking_mouse_down::src_comp != 0) {
              newS = newS ^ 0xffffffff;
            }
            x32byta._4_4_ = dst32addr._4_4_;
          }
          goto LAB_001442be;
        }
        if ((dstold < (uint)dst32lbit) && (0x20 < dst32lbit + taking_mouse_down::w)) {
          puVar6 = _savedS + 1;
          uVar1 = *_savedS;
          _savedS = _savedS + 2;
          newS = uVar1 << sVar3 | *puVar6 >> sVar2 & dstdata;
          srcRshift = *puVar6 << sVar3 & (dstdata ^ 0xffffffff);
        }
        else {
          if (dstold < (uint)dst32lbit) {
            newS = *_savedS << sVar3;
          }
          else {
            newS = *_savedS >> sVar2 & dstdata;
            srcRshift = *_savedS << sVar3 & (dstdata ^ 0xffffffff);
          }
          _savedS = _savedS + 1;
        }
        if (taking_mouse_down::src_comp != 0) {
          newS = newS ^ 0xffffffff;
        }
        if ((int)(dstold + taking_mouse_down::w) < 0x21) {
          x32byta._4_4_ = (uint)dst32addr;
          goto LAB_001442be;
        }
        local_38 = *_preloop_mask;
        uVar1 = local_38 & ~sdw_mask;
        switch(taking_mouse_down::op) {
        case 0:
          local_38 = newS;
          break;
        case 1:
          local_38 = newS & local_38;
          break;
        case 2:
          local_38 = newS | local_38;
          break;
        case 3:
          local_38 = newS ^ local_38;
        }
        *_preloop_mask = uVar1 | sdw_mask & local_38;
        src32addr = _preloop_mask + 1;
        if (dst32lbit == dstold) {
          if (taking_mouse_down::src_comp == 0) {
            switch(taking_mouse_down::op) {
            case 0:
              local_b4 = srcLshift;
              while (local_b4 = local_b4 + -1, -1 < local_b4) {
                *src32addr = *_savedS;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 1:
              local_b4 = srcLshift;
              while (local_b4 = local_b4 + -1, -1 < local_b4) {
                *src32addr = *_savedS & *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 2:
              local_b4 = srcLshift;
              while (local_b4 = local_b4 + -1, -1 < local_b4) {
                *src32addr = *_savedS | *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 3:
              local_b4 = srcLshift;
              while (local_b4 = local_b4 + -1, -1 < local_b4) {
                *src32addr = *_savedS ^ *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
            }
          }
          else {
            switch(taking_mouse_down::op) {
            case 0:
              local_b0 = srcLshift;
              while (local_b0 = local_b0 + -1, -1 < local_b0) {
                *src32addr = *_savedS ^ 0xffffffff;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 1:
              local_b0 = srcLshift;
              while (local_b0 = local_b0 + -1, -1 < local_b0) {
                *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 2:
              local_b0 = srcLshift;
              while (local_b0 = local_b0 + -1, -1 < local_b0) {
                *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 3:
              local_b0 = srcLshift;
              while (local_b0 = local_b0 + -1, -1 < local_b0) {
                *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
            }
          }
        }
        else if (taking_mouse_down::src_comp == 0) {
          switch(taking_mouse_down::op) {
          case 0:
            local_bc = srcLshift;
            while (local_bc = local_bc + -1, -1 < local_bc) {
              uVar1 = srcRshift | *_savedS >> sVar2;
              srcRshift = *_savedS << sVar3;
              *src32addr = uVar1;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_bc = srcLshift;
            while (local_bc = local_bc + -1, -1 < local_bc) {
              uVar1 = srcRshift | *_savedS >> sVar2;
              srcRshift = *_savedS << sVar3;
              *src32addr = uVar1 & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_bc = srcLshift;
            while (local_bc = local_bc + -1, -1 < local_bc) {
              uVar1 = srcRshift | *_savedS >> sVar2;
              srcRshift = *_savedS << sVar3;
              *src32addr = uVar1 | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_bc = srcLshift;
            while (local_bc = local_bc + -1, -1 < local_bc) {
              uVar1 = srcRshift | *_savedS >> sVar2;
              srcRshift = *_savedS << sVar3;
              *src32addr = uVar1 ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
        else {
          switch(taking_mouse_down::op) {
          case 0:
            local_b8 = srcLshift;
            while (local_b8 = local_b8 + -1, -1 < local_b8) {
              uVar1 = srcRshift | *_savedS >> sVar2;
              srcRshift = *_savedS << sVar3;
              *src32addr = uVar1 ^ 0xffffffff;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_b8 = srcLshift;
            while (local_b8 = local_b8 + -1, -1 < local_b8) {
              uVar1 = srcRshift | *_savedS >> sVar2;
              srcRshift = *_savedS << sVar3;
              *src32addr = (uVar1 ^ 0xffffffff) & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_b8 = srcLshift;
            while (local_b8 = local_b8 + -1, -1 < local_b8) {
              uVar1 = srcRshift | *_savedS >> sVar2;
              srcRshift = *_savedS << sVar3;
              *src32addr = uVar1 ^ 0xffffffff | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_b8 = srcLshift;
            while (local_b8 = local_b8 + -1, -1 < local_b8) {
              uVar1 = srcRshift | *_savedS >> sVar2;
              srcRshift = *_savedS << sVar3;
              *src32addr = uVar1 ^ 0xffffffff ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
        if (fwd != 0x1f) {
          if ((uint)fwd < OrigSrcAddr._4_4_) {
            newS = srcRshift;
          }
          else {
            newS = srcRshift | *_savedS >> sVar2 & dstdata;
          }
          if (taking_mouse_down::src_comp != 0) {
            newS = newS ^ 0xffffffff;
          }
          x32byta._4_4_ = dst32addr._4_4_;
          goto LAB_001442be;
        }
      }
      else {
        srcRmask = dst32lbit - dstold & 0xf;
        uVar1 = CONCAT22(*dstbase,*dstbase) << (sbyte)srcRmask;
        newS = uVar1 >> 0x10 | uVar1;
        if (taking_mouse_down::src_comp != 0) {
          newS = newS ^ 0xffffffff;
        }
        if ((int)(dstold + taking_mouse_down::w) < 0x21) {
          x32byta._4_4_ = (uint)dst32addr;
        }
        else {
          local_38 = *_preloop_mask;
          uVar1 = local_38 & ~sdw_mask;
          switch(taking_mouse_down::op) {
          case 0:
            local_38 = newS;
            break;
          case 1:
            local_38 = newS & local_38;
            break;
          case 2:
            local_38 = newS | local_38;
            break;
          case 3:
            local_38 = newS ^ local_38;
          }
          *_preloop_mask = local_38 & sdw_mask | uVar1;
          src32addr = _preloop_mask + 1;
          switch(taking_mouse_down::op) {
          case 0:
            local_ac = srcLshift;
            while (local_ac = local_ac + -1, -1 < local_ac) {
              *src32addr = newS;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_ac = srcLshift;
            while (local_ac = local_ac + -1, -1 < local_ac) {
              *src32addr = newS & *src32addr;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_ac = srcLshift;
            while (local_ac = local_ac + -1, -1 < local_ac) {
              *src32addr = newS | *src32addr;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_ac = srcLshift;
            while (local_ac = local_ac + -1, -1 < local_ac) {
              *src32addr = newS ^ *src32addr;
              src32addr = src32addr + 1;
            }
          }
          if (fwd == 0x1f) goto LAB_00144352;
          x32byta._4_4_ = dst32addr._4_4_;
        }
LAB_001442be:
        local_38 = *src32addr;
        uVar1 = local_38 & ~x32byta._4_4_;
        switch(taking_mouse_down::op) {
        case 0:
          local_38 = newS;
          break;
        case 1:
          local_38 = newS & local_38;
          break;
        case 2:
          local_38 = newS | local_38;
          break;
        case 3:
          local_38 = newS ^ local_38;
        }
        *src32addr = uVar1 | x32byta._4_4_ & local_38;
      }
LAB_00144352:
      iVar5 = taking_mouse_down::dstbpl >> 5;
      src32lbit = iVar4;
      if (taking_mouse_down::gray == 0) {
        iVar4 = taking_mouse_down::srcbpl >> 5;
        if (bVar8) {
          if (bVar9) {
            lVar7 = (long)iVar5 * 4;
          }
          else {
            uVar1 = taking_mouse_down::dstbpl + fwd;
            if ((int)uVar1 < 0) {
              lVar7 = (long)((int)(0x1f - uVar1) >> 5) * -4;
            }
            else {
              lVar7 = (long)((int)dstold >> 5) * 4;
            }
            fwd = uVar1 & 0x1f;
            dstold = (fwd - taking_mouse_down::w) + 1U & 0x1f;
            sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
            if (dstold == 0) {
              local_168 = 0xffffffff;
            }
            else {
              local_168 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
            }
            dst32addr._4_4_ = local_168;
            dst32addr._0_4_ = sdw_mask & local_168;
            if ((taking_mouse_down::w - fwd) + -1 < 1) {
              local_16c = 0;
            }
            else {
              local_16c = (taking_mouse_down::w - fwd) + -1 >> 5;
            }
            srcLshift = local_16c;
          }
          src32addr = (uint *)((long)_preloop_mask + lVar7);
          if (bVar9) {
            lVar7 = (long)iVar4 * 4;
          }
          else {
            uVar1 = taking_mouse_down::srcbpl + OrigSrcAddr._4_4_;
            if ((int)uVar1 < 0) {
              lVar7 = (long)((int)(0x1f - uVar1) >> 5) * -4;
            }
            else {
              lVar7 = (long)((int)uVar1 >> 5) * 4;
            }
            OrigSrcAddr._4_4_ = uVar1 & 0x1f;
            dst32lbit = (OrigSrcAddr._4_4_ - taking_mouse_down::w) + 1 & 0x1f;
            local_a8 = dstold - dst32lbit & 0x1f;
            srcRmask = dst32lbit - dstold & 0x1f;
            if (srcRmask == 0) {
              local_170 = 0;
            }
            else {
              local_170 = -1 << (sbyte)srcRmask ^ 0xffffffff;
            }
            dstdata = local_170;
          }
          _savedS = (uint *)((long)OrigDstAddr + lVar7);
          _preloop_mask = src32addr;
          OrigDstAddr = _savedS;
        }
        else {
          if (!bVar9) {
            iVar5 = (int)(taking_mouse_down::dstbpl + dstold) >> 5;
            dstold = taking_mouse_down::dstbpl + dstold & 0x1f;
            fwd = (dstold + taking_mouse_down::w) - 1 & 0x1f;
            if (dstold == 0) {
              local_160 = 0xffffffff;
            }
            else {
              local_160 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
            }
            sdw_mask = local_160;
            dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
            dst32addr._0_4_ = local_160 & dst32addr._4_4_;
            srcLshift = ((int)(dstold + taking_mouse_down::w) >> 5) + -1;
          }
          _preloop_mask = _preloop_mask + iVar5;
          if (!bVar9) {
            iVar4 = taking_mouse_down::srcbpl + dst32lbit >> 5;
            dst32lbit = taking_mouse_down::srcbpl + dst32lbit & 0x1f;
            OrigSrcAddr._4_4_ = (dst32lbit + taking_mouse_down::w) - 1U & 0x1f;
            local_a8 = dstold - dst32lbit & 0x1f;
            srcRmask = dst32lbit - dstold & 0x1f;
            if (srcRmask == 0) {
              local_164 = 0xffffffff;
            }
            else {
              local_164 = -1 << (sbyte)srcRmask ^ 0xffffffff;
            }
            dstdata = local_164;
          }
          OrigDstAddr = OrigDstAddr + iVar4;
          _savedS = OrigDstAddr;
        }
      }
      else {
        if (!bVar9) {
          iVar5 = (int)(taking_mouse_down::dstbpl + dstold) >> 5;
          dstold = taking_mouse_down::dstbpl + dstold & 0x1f;
          fwd = (dstold + taking_mouse_down::w) - 1 & 0x1f;
          if (dstold == 0) {
            local_15c = 0xffffffff;
          }
          else {
            local_15c = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
          }
          sdw_mask = local_15c;
          dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
          dst32addr._0_4_ = local_15c & dst32addr._4_4_;
          srcLshift = ((int)(dstold + taking_mouse_down::w) >> 5) + -1;
        }
        _preloop_mask = _preloop_mask + iVar5;
        taking_mouse_down::curr_gray_line = taking_mouse_down::curr_gray_line + 1;
        if (taking_mouse_down::curr_gray_line < taking_mouse_down::num_gray) {
          dstbase = dstbase + 1;
        }
        else {
          taking_mouse_down::curr_gray_line = 0;
          dstbase = dstbase + -(long)(taking_mouse_down::num_gray + -1);
        }
      }
    }
  }
  return;
}

Assistant:

void taking_mouse_down(void) {
  DLword *srcbase, *dstbase;
  static int sx, dx, w, h, srcbpl, dstbpl, backwardflg = 0;
  static int src_comp = 0, op = 0, gray = 0, num_gray = 0, curr_gray_line = 0;

#ifdef DOS
  (currentdsp->mouse_invisible)(currentdsp, IOPage);
#else
  if (!DisplayInitialized) return;

  /* restore saved image */
  srcbase = MonoCursor_savebitmap;
  dstbase = DisplayRegion68k + ((LastCursorY)*DLWORD_PERLINE); /* old y */
  sx = 0;
  dx = LastCursorX;        /* old x */
  w = LastCursorClippingX; /* Old clipping */
  h = LastCursorClippingY;
  srcbpl = HARD_CURSORWIDTH;
  dstbpl = displaywidth;
  op = 0;
  new_bitblt_code;
#ifdef DISPLAYBUFFER
  flush_display_region(dx, (LastCursorY), w, h);
#endif /* DISPLAYBUFFER */
#endif /* DOS */
}